

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

bool EV_StopPoly(int polynum)

{
  FPolyObj *pFVar1;
  DPolyAction *pDVar2;
  
  pFVar1 = PO_GetPolyobj(polynum);
  if (pFVar1 != (FPolyObj *)0x0) {
    pDVar2 = GC::ReadBarrier<DPolyAction>((DPolyAction **)&pFVar1->specialdata);
    if (pDVar2 != (DPolyAction *)0x0) {
      pDVar2 = GC::ReadBarrier<DPolyAction>((DPolyAction **)&pFVar1->specialdata);
      DPolyAction::Stop(pDVar2);
    }
  }
  return pFVar1 != (FPolyObj *)0x0;
}

Assistant:

bool EV_StopPoly(int polynum)
{
	FPolyObj *poly;

	if (NULL != (poly = PO_GetPolyobj(polynum)))
	{
		if (poly->specialdata != NULL)
		{
			poly->specialdata->Stop();
		}
		return true;
	}
	return false;
}